

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O0

bool re2c::matches(Span *b1,uint32_t n1,State *s1,Span *b2,uint32_t n2,State *s2)

{
  Span *pSVar1;
  bool bVar2;
  uint32_t local_5c;
  uint32_t lb2;
  Span *e2;
  uint32_t lb1;
  Span *e1;
  State *s2_local;
  Span *pSStack_30;
  uint32_t n2_local;
  Span *b2_local;
  State *s1_local;
  Span *pSStack_18;
  uint32_t n1_local;
  Span *b1_local;
  
  e2._4_4_ = 0;
  pSVar1 = b2 + n2;
  local_5c = 0;
  pSStack_18 = b1;
  pSStack_30 = b2;
  while( true ) {
    while( true ) {
      bVar2 = false;
      if (pSStack_18 < b1 + n1) {
        bVar2 = pSStack_18->to != s1;
      }
      if (!bVar2) break;
      e2._4_4_ = pSStack_18->ub;
      pSStack_18 = pSStack_18 + 1;
    }
    while( true ) {
      bVar2 = false;
      if (pSStack_30 < pSVar1) {
        bVar2 = pSStack_30->to != s2;
      }
      if (!bVar2) break;
      local_5c = pSStack_30->ub;
      pSStack_30 = pSStack_30 + 1;
    }
    if (pSStack_18 == b1 + n1) {
      return pSStack_30 == pSVar1;
    }
    if (pSStack_30 == pSVar1) {
      return false;
    }
    if ((e2._4_4_ != local_5c) || (pSStack_18->ub != pSStack_30->ub)) break;
    pSStack_18 = pSStack_18 + 1;
    pSStack_30 = pSStack_30 + 1;
  }
  return false;
}

Assistant:

bool matches(const Span * b1, uint32_t n1, const State * s1, const Span * b2, uint32_t n2, const State * s2)
{
	const Span * e1 = &b1[n1];
	uint32_t lb1 = 0;
	const Span * e2 = &b2[n2];
	uint32_t lb2 = 0;

	for (;;)
	{
		for (; b1 < e1 && b1->to != s1; ++b1)
		{
			lb1 = b1->ub;
		}
		for (; b2 < e2 && b2->to != s2; ++b2)
		{
			lb2 = b2->ub;
		}
		if (b1 == e1)
		{
			return b2 == e2;
		}
		if (b2 == e2)
		{
			return false;
		}
		if (lb1 != lb2 || b1->ub != b2->ub)
		{
			return false;
		}
		++b1;
		++b2;
	}
}